

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *data;
  conncache *h;
  long lVar1;
  connectbundle *pcVar2;
  connectbundle *p;
  size_t key_len;
  char **in_RCX;
  CURLcode CVar3;
  bool bVar4;
  char key [128];
  char local_b8 [136];
  
  data = conn->data;
  CVar3 = CURLE_OK;
  pcVar2 = Curl_conncache_find_bundle(conn,(data->state).conn_cache,(char **)0x0);
  if (pcVar2 == (connectbundle *)0x0) {
    p = (connectbundle *)(*Curl_cmalloc)(0x30);
    if (p == (connectbundle *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      p->num_connections = 0;
      p->multiuse = 0;
      Curl_llist_init(&p->conn_list,conn_llist_dtor);
      CVar3 = CURLE_OK;
    }
    if (p == (connectbundle *)0x0) {
LAB_0013bc11:
      pcVar2 = (connectbundle *)0x0;
      bVar4 = false;
    }
    else {
      hashkey(conn,local_b8,0,in_RCX);
      h = (data->state).conn_cache;
      key_len = strlen(local_b8);
      pcVar2 = (connectbundle *)Curl_hash_add(&h->hash,local_b8,key_len,p);
      bVar4 = pcVar2 != (connectbundle *)0x0;
      if (bVar4) {
        pcVar2 = p;
      }
      CVar3 = CURLE_OK;
      if (!bVar4) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      if (p != (connectbundle *)0x0 && !bVar4) {
        Curl_llist_destroy(&p->conn_list,(void *)0x0);
        (*Curl_cfree)(p);
        CVar3 = CURLE_OUT_OF_MEMORY;
        goto LAB_0013bc11;
      }
    }
    if (!bVar4) goto LAB_0013bc50;
  }
  Curl_llist_insert_next(&pcVar2->conn_list,(pcVar2->conn_list).tail,conn,&conn->bundle_node);
  conn->bundle = pcVar2;
  pcVar2->num_connections = pcVar2->num_connections + 1;
  lVar1 = connc->next_connection_id;
  connc->next_connection_id = lVar1 + 1;
  conn->connection_id = lVar1;
  connc->num_conn = connc->num_conn + 1;
LAB_0013bc50:
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache, NULL);
  if(!bundle) {
    int rc;
    char key[HASHKEY_SIZE];

    result = bundle_create(data, &new_bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key), NULL);
    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);

    if(!rc) {
      bundle_destroy(new_bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
    bundle = new_bundle;
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %zu members\n",
               conn->connection_id, connc->num_conn));

  unlock:
  CONN_UNLOCK(data);

  return result;
}